

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitIO.cpp
# Opt level: O1

void __thiscall BitOutStream::crcCheck(BitOutStream *this,bool filled)

{
  byte *pbVar1;
  byte *pbVar2;
  pointer puVar3;
  byte bVar4;
  long lVar5;
  byte bVar6;
  byte *pbVar7;
  long lVar8;
  byte bVar9;
  uchar local_12;
  uchar local_11;
  
  if (this->numCrcBytes == this->maxBuffer) {
    pbVar1 = (this->crcBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (this->crcBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    lVar5 = (long)pbVar2 - (long)pbVar1;
    if (lVar5 != 0) {
      bVar6 = 0;
      pbVar7 = pbVar1;
      do {
        bVar6 = bVar6 ^ *pbVar7;
        lVar8 = 8;
        do {
          bVar4 = bVar6 * '\x02';
          bVar9 = (char)bVar6 >> 7 & 0x9b;
          bVar6 = bVar9 ^ bVar4;
          lVar8 = lVar8 + -1;
        } while (lVar8 != 0);
        pbVar7 = pbVar7 + 1;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
      if (bVar9 != bVar4) {
        this->failedSync = true;
        return;
      }
    }
    if (this->done == true) {
      this->crcFlag = false;
      if (pbVar2 != pbVar1) {
        (this->crcBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = pbVar1;
      }
      puVar3 = (this->wBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((this->wBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar3) {
        (this->wBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar3;
      }
      this->numCrcBytes = 0;
      this->nBitsDone = 0;
    }
    else if (filled) {
      if (pbVar2 != pbVar1) {
        (this->crcBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = pbVar1;
      }
      puVar3 = (this->wBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((this->wBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar3) {
        (this->wBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar3;
      }
      if (this->sync == 1) {
        this->numCrcBytes = 0;
        this->crcFlag = false;
      }
    }
    else {
      if (pbVar2 != pbVar1) {
        (this->crcBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = pbVar1;
      }
      this->crcFlag = false;
      this->numCrcBytes = 0;
      this->nBitsDone = 0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&this->wBuffer,&local_11);
      this->cByte = '\0';
      this->nBitsDone = 0;
      this->bCount = this->bCount + 1;
    }
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&this->crcBuffer,&local_12);
    this->numCrcBytes = this->numCrcBytes + 1;
    this->cByte = '\0';
    this->nBitsDone = 0;
    crcCheck(this,true);
  }
  return;
}

Assistant:

void BitOutStream::crcCheck(bool filled) {
    if (numCrcBytes == maxBuffer) {
        if (CRC::Calculate(crcBuffer.data(), crcBuffer.size() * sizeof(char), CRC::CRC_8_LTE()) != 0) {
            failedSync = true;
        } else if(done){
            crcFlag = false;
            crcBuffer.clear();
            wBuffer.clear();
            numCrcBytes = 0;
            nBitsDone = 0;
        } else if (filled) {
            crcBuffer.clear();
            wBuffer.clear();
            if (sync == 1) {
                numCrcBytes = 0;
                crcFlag = false;
            }
        } else {
            crcBuffer.clear();
            crcFlag = false;
            numCrcBytes = 0;
            nBitsDone = 0;
            fillBuffer();
        }
    } else {
        crcBuffer.push_back(static_cast<unsigned char>(cByte));
        numCrcBytes++;
        cByte = static_cast<unsigned char>(0);
        nBitsDone = 0;
        crcCheck(true);
    }
}